

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  blockType_e bVar1;
  size_t __n;
  unsigned_long_long uVar2;
  ZSTD_dStage ZVar3;
  size_t err_code;
  ulong uVar4;
  size_t sVar5;
  XXH64_hash_t XVar6;
  blockProperties_t bp;
  blockProperties_t local_3c;
  
  if (dctx->stage - ZSTDds_decompressBlock < 2) {
    uVar4 = dctx->expected;
    if (dctx->bType == bt_raw) {
      if (srcSize <= uVar4) {
        uVar4 = srcSize;
      }
      uVar4 = uVar4 + (uVar4 == 0);
    }
  }
  else {
    uVar4 = dctx->expected;
  }
  if (uVar4 != srcSize) {
    return 0xffffffffffffffb8;
  }
  ZSTD_checkContinuity(dctx,dst,dstCapacity);
  dctx->processedCSize = dctx->processedCSize + srcSize;
  switch(dctx->stage) {
  case ZSTDds_getFrameHeaderSize:
    if (src == (void *)0x0) {
      __assert_fail("src != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x4ee,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if (dctx->format == ZSTD_f_zstd1) {
      if (srcSize < 4) {
        __assert_fail("srcSize >= ZSTD_FRAMEIDSIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x4f0,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        memcpy(dctx->headerBuffer,src,srcSize);
        dctx->expected = 8 - srcSize;
        dctx->stage = ZSTDds_decodeSkippableHeader;
        return 0;
      }
    }
    sVar5 = ZSTD_frameHeaderSize_internal(src,srcSize,dctx->format);
    dctx->headerSize = sVar5;
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    memcpy(dctx->headerBuffer,src,srcSize);
    dctx->expected = sVar5 - srcSize;
    dctx->stage = ZSTDds_decodeFrameHeader;
    break;
  case ZSTDds_decodeFrameHeader:
    if (src == (void *)0x0) {
      __assert_fail("src != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x4ff,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    memcpy((void *)((long)dctx + (dctx->headerSize - srcSize) + 0x176bc),src,srcSize);
    sVar5 = ZSTD_decodeFrameHeader(dctx,dctx->headerBuffer,dctx->headerSize);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    dctx->expected = 3;
    dctx->stage = ZSTDds_decodeBlockHeader;
    break;
  case ZSTDds_decodeBlockHeader:
    sVar5 = ZSTD_getcBlockSize(src,3,&local_3c);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    if ((dctx->fParams).blockSizeMax < sVar5) {
      return 0xffffffffffffffec;
    }
    dctx->expected = sVar5;
    dctx->bType = local_3c.blockType;
    dctx->rleSize = (ulong)local_3c.origSize;
    if (sVar5 == 0) {
      if (local_3c.lastBlock == 0) {
        dctx->expected = 3;
        ZVar3 = ZSTDds_decodeBlockHeader;
      }
      else if ((dctx->fParams).checksumFlag == 0) {
        dctx->expected = 0;
        ZVar3 = ZSTDds_getFrameHeaderSize;
      }
      else {
        dctx->expected = 4;
        ZVar3 = ZSTDds_checkChecksum;
      }
    }
    else {
      ZVar3 = ZSTDds_decompressLastBlock - (local_3c.lastBlock == 0);
    }
    dctx->stage = ZVar3;
    break;
  case ZSTDds_decompressBlock:
  case ZSTDds_decompressLastBlock:
    bVar1 = dctx->bType;
    if (bVar1 == bt_raw) {
      if (dctx->expected < srcSize) {
        __assert_fail("srcSize <= dctx->expected",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x52e,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      uVar4 = 0xffffffffffffffba;
      if (srcSize <= dstCapacity) {
        if (dst == (void *)0x0) {
          uVar4 = 0xffffffffffffffb6;
          if (srcSize == 0) {
            uVar4 = srcSize;
          }
        }
        else {
          memmove(dst,src,srcSize);
          uVar4 = srcSize;
        }
      }
      if (0xffffffffffffff88 < uVar4) {
        return uVar4;
      }
      if (uVar4 != srcSize) {
        __assert_fail("rSize == srcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                      ,0x531,
                      "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                     );
      }
      dctx->expected = dctx->expected - uVar4;
    }
    else {
      if (bVar1 == bt_rle) {
        __n = dctx->rleSize;
        uVar4 = 0xffffffffffffffba;
        if (__n <= dstCapacity) {
          if (dst == (void *)0x0) {
            uVar4 = 0xffffffffffffffb6;
            if (__n == 0) {
              uVar4 = __n;
            }
          }
          else {
            memset(dst,(uint)*src,__n);
            uVar4 = __n;
          }
        }
      }
      else {
        if (bVar1 != bt_compressed) {
          return 0xffffffffffffffec;
        }
        uVar4 = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,1,is_streaming);
      }
      dctx->expected = 0;
    }
    if (0xffffffffffffff88 < uVar4) {
      return uVar4;
    }
    if ((dctx->fParams).blockSizeMax < uVar4) {
      return 0xffffffffffffffec;
    }
    dctx->decodedSize = dctx->decodedSize + uVar4;
    if (dctx->validateChecksum != 0) {
      ZSTD_XXH64_update(&dctx->xxhState,dst,uVar4);
    }
    dctx->previousDstEnd = (void *)((long)dst + uVar4);
    if (dctx->expected != 0) {
      return uVar4;
    }
    if (dctx->stage != ZSTDds_decompressLastBlock) {
      dctx->stage = ZSTDds_decodeBlockHeader;
      dctx->expected = 3;
      return uVar4;
    }
    uVar2 = (dctx->fParams).frameContentSize;
    if ((uVar2 != 0xffffffffffffffff) && (dctx->decodedSize != uVar2)) {
      return 0xffffffffffffffec;
    }
    if ((dctx->fParams).checksumFlag == 0) {
      ZSTD_DCtx_trace_end(dctx,dctx->decodedSize,dctx->processedCSize,1);
      dctx->expected = 0;
      dctx->stage = ZSTDds_getFrameHeaderSize;
      return uVar4;
    }
    dctx->expected = 4;
    dctx->stage = ZSTDds_checkChecksum;
    return uVar4;
  case ZSTDds_checkChecksum:
    if (srcSize != 4) {
      __assert_fail("srcSize == 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x55e,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if ((dctx->validateChecksum != 0) &&
       (XVar6 = ZSTD_XXH64_digest(&dctx->xxhState), *src != (int)XVar6)) {
      return 0xffffffffffffffea;
    }
    ZSTD_DCtx_trace_end(dctx,dctx->decodedSize,dctx->processedCSize,1);
  case ZSTDds_skipFrame:
    dctx->expected = 0;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    break;
  case ZSTDds_decodeSkippableHeader:
    if (src == (void *)0x0) {
      __assert_fail("src != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x56d,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    if (8 < srcSize) {
      __assert_fail("srcSize <= ZSTD_SKIPPABLEHEADERSIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                    ,0x56e,
                    "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                   );
    }
    memcpy((void *)((long)dctx + (0x176c4 - srcSize)),src,srcSize);
    dctx->expected = (ulong)*(uint *)(dctx->headerBuffer + 4);
    dctx->stage = ZSTDds_skipFrame;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress.c"
                  ,0x57a,
                  "size_t ZSTD_decompressContinue(ZSTD_DCtx *, void *, size_t, const void *, size_t)"
                 );
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (unsigned)srcSize);
    /* Sanity check */
    RETURN_ERROR_IF(srcSize != ZSTD_nextSrcSizeToDecompressWithInputSize(dctx, srcSize), srcSize_wrong, "not allowed");
    ZSTD_checkContinuity(dctx, dst, dstCapacity);

    dctx->processedCSize += srcSize;

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_FRAMEIDSIZE);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_SKIPPABLEHEADERSIZE - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        ZSTD_memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        ZSTD_memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        FORWARD_IF_ERROR(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize), "");
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            RETURN_ERROR_IF(cBlockSize > dctx->fParams.blockSizeMax, corruption_detected, "Block Size Exceeds Maximum");
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1, is_streaming);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_raw :
                assert(srcSize <= dctx->expected);
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                FORWARD_IF_ERROR(rSize, "ZSTD_copyRawBlock failed");
                assert(rSize == srcSize);
                dctx->expected -= rSize;
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, *(const BYTE*)src, dctx->rleSize);
                dctx->expected = 0;  /* Streaming not supported */
                break;
            case bt_reserved :   /* should never happen */
            default:
                RETURN_ERROR(corruption_detected, "invalid block type");
            }
            FORWARD_IF_ERROR(rSize, "");
            RETURN_ERROR_IF(rSize > dctx->fParams.blockSizeMax, corruption_detected, "Decompressed Block Size Exceeds Maximum");
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (unsigned)rSize);
            dctx->decodedSize += rSize;
            if (dctx->validateChecksum) XXH64_update(&dctx->xxhState, dst, rSize);
            dctx->previousDstEnd = (char*)dst + rSize;

            /* Stay on the same stage until we are finished streaming the block. */
            if (dctx->expected > 0) {
                return rSize;
            }

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (unsigned)dctx->decodedSize);
                RETURN_ERROR_IF(
                    dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN
                 && dctx->decodedSize != dctx->fParams.frameContentSize,
                    corruption_detected, "");
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {
            if (dctx->validateChecksum) {
                U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
                U32 const check32 = MEM_readLE32(src);
                DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", (unsigned)h32, (unsigned)check32);
                RETURN_ERROR_IF(check32 != h32, checksum_wrong, "");
            }
            ZSTD_DCtx_trace_end(dctx, dctx->decodedSize, dctx->processedCSize, /* streaming */ 1);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_SKIPPABLEHEADERSIZE);
        ZSTD_memcpy(dctx->headerBuffer + (ZSTD_SKIPPABLEHEADERSIZE - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_FRAMEIDSIZE);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        assert(0);   /* impossible */
        RETURN_ERROR(GENERIC, "impossible to reach");   /* some compilers require default to do something */
    }
}